

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pardiso_loader.c
# Opt level: O3

c_int lh_unload_pardiso(void)

{
  int iVar1;
  
  if (Pardiso_handle == (soHandle_t)0x0) {
    return 0;
  }
  iVar1 = dlclose();
  return (long)iVar1;
}

Assistant:

c_int lh_unload_pardiso() {

    if (Pardiso_handle == OSQP_NULL) return 0;

    return lh_unload_lib(Pardiso_handle);

    /* If multiple OSQP objects are laoded, the lines below cause a crash */
    // Pardiso_handle = OSQP_NULL;
    // func_pardiso = OSQP_NULL;
    // func_mkl_set_interface_layer = OSQP_NULL;
    // func_mkl_get_max_threads = OSQP_NULL;

}